

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

void Bpgetrast(char *fn,float *bf,int sx,int sy,int r)

{
  uint uVar1;
  ssize_t sVar2;
  uint uVar3;
  ulong uVar4;
  int extraout_EDX;
  long extraout_RDX;
  ulong unaff_RBX;
  int *unaff_RBP;
  int iVar5;
  byte *__buf;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined8 in_R9;
  ulong uVar10;
  ulong uVar11;
  byte *unaff_R13;
  ulong uVar12;
  long lVar13;
  byte *__buf_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  uchar c;
  byte bStack_8d;
  uint uStack_8c;
  ulong uStack_88;
  long lStack_80;
  ulong uStack_78;
  ulong uStack_70;
  byte *pbStack_68;
  float *pfStack_60;
  byte *pbStack_58;
  code *pcStack_50;
  byte local_45;
  uint local_44;
  byte *local_40;
  long local_38;
  
  uVar4 = (ulong)(uint)r;
  uVar10 = (ulong)(uint)r;
  pbVar6 = (byte *)(ulong)(uint)sy;
  __buf = (byte *)0x0;
  pcStack_50 = (code *)0x102e81;
  local_44 = sx;
  uVar3 = sy;
  uVar1 = open(fn,0);
  uVar9 = (uint)uVar4;
  iVar8 = (int)in_R9;
  __buf_00 = pbVar6;
  if (0 < (int)uVar1) {
    unaff_RBP = (int *)(ulong)uVar1;
    if (0 < sy) {
      unaff_RBX = (ulong)local_44;
      local_38 = (long)r << 2;
      unaff_R13 = (byte *)0x0;
      __buf_00 = &local_45;
      local_40 = pbVar6;
      do {
        if (0 < (int)local_44) {
          uVar10 = 0;
          do {
            pcStack_50 = (code *)0x102ec9;
            __buf = __buf_00;
            fn = (char *)unaff_RBP;
            sVar2 = read(uVar1,__buf_00,1);
            uVar3 = (uint)pbVar6;
            uVar9 = (uint)uVar4;
            iVar8 = (int)in_R9;
            if (sVar2 != 1) {
              pcStack_50 = (code *)0x102f12;
              Bpgetrast_cold_2();
              goto LAB_00102f12;
            }
            bf[uVar10] = (float)local_45;
            uVar10 = uVar10 + 1;
          } while (unaff_RBX != uVar10);
        }
        unaff_R13 = unaff_R13 + 1;
        bf = (float *)((long)bf + local_38);
      } while (unaff_R13 != local_40);
    }
    close(uVar1);
    return;
  }
LAB_00102f12:
  pcStack_50 = pputrast;
  Bpgetrast_cold_1();
  uVar4 = (ulong)uVar9;
  pbVar6 = (byte *)0x180;
  uStack_8c = uVar3;
  uStack_78 = unaff_RBX;
  uStack_70 = uVar10;
  pbStack_68 = unaff_R13;
  pfStack_60 = bf;
  pbStack_58 = __buf_00;
  pcStack_50 = (code *)unaff_RBP;
  uVar1 = creat(fn,0x180);
  if ((int)uVar1 < 1) {
LAB_00102fe1:
    pputrast_cold_1();
  }
  else {
    fn = (char *)(ulong)uVar1;
    sVar2 = write(uVar1,__buf,0x20);
    pbVar6 = __buf;
    if (sVar2 == 0x20) {
      if (0 < (int)uVar9) {
        uVar10 = (ulong)uStack_8c;
        lStack_80 = (long)iVar8 << 2;
        uVar12 = 0;
        lVar13 = extraout_RDX;
        uStack_88 = uVar4;
        do {
          if (0 < (int)uStack_8c) {
            uVar11 = 0;
            do {
              bStack_8d = (byte)(int)*(float *)(lVar13 + uVar11 * 4);
              fn = (char *)(ulong)uVar1;
              pbVar6 = &bStack_8d;
              sVar2 = write(uVar1,&bStack_8d,1);
              uVar3 = (uint)uVar4;
              if (sVar2 != 1) {
                pputrast_cold_3();
                goto LAB_00102fe1;
              }
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + lStack_80;
        } while (uVar12 != uStack_88);
      }
      close(uVar1);
      return;
    }
  }
  pputrast_cold_2();
  if (0 < (int)uVar3) {
    uVar1 = 0;
    do {
      iVar8 = *(int *)fn;
      iVar7 = extraout_EDX;
      uVar9 = uVar3;
      do {
        iVar5 = (int)pbVar6;
        *(ulong *)(*(long *)((long)fn + 0x158) + (long)(iVar8 * iVar5 + iVar7) * 8) =
             CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        iVar8 = *(int *)fn;
        *(ulong *)(*(long *)((long)fn + ((long)(*(int *)((long)fn + 0xc) / 2) * 2 + 0x2e) * 4) +
                   0x24 + (long)(iVar5 * iVar8 + iVar7) * 0x30) =
             CONCAT44((float)in_XMM2_Qa,(float)(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
        iVar7 = iVar7 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      uVar1 = uVar1 + 1;
      pbVar6 = (byte *)(ulong)(iVar5 + 1);
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

void Bpgetrast(fn,bf,sx,sy,r)
char *fn ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = open(fn,O_RDONLY)) > 0) { ;
    for (i = 0 ; i < sy ; i++) {
      for (j = 0 ; j < sx ; j++) {
        if (read(fd,&c,sizeof(c)) != 1) {
          error(4) ;
        }
        bf[r*i + j] = (float)c ;
      }
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}